

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

int al_fputs(ALLEGRO_FILE *f,char *p)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = strlen(p);
  f->ungetc_len = 0;
  sVar3 = (*f->vtable->fi_fwrite)(f,p,sVar2);
  iVar1 = -1;
  if (sVar3 == sVar2) {
    iVar1 = (int)sVar2;
  }
  return iVar1;
}

Assistant:

int al_fputs(ALLEGRO_FILE *f, char const *p)
{
   size_t n;
   ASSERT(f);
   ASSERT(p);

   n = strlen(p);
   if (al_fwrite(f, p, n) != n) {
      return EOF;
   }

   return n;
}